

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void mpt_copy_df(int pts,double *src,int lds,float *dest,int ldd)

{
  double dVar1;
  ulong uVar2;
  bool bVar3;
  
  if (0 < pts) {
    if (ldd == 0) {
      *dest = (float)src[(pts + -1) * lds];
    }
    else if (lds == 0) {
      dVar1 = *src;
      for (uVar2 = 0; (uint)pts != uVar2; uVar2 = uVar2 + 1) {
        dest[uVar2] = (float)dVar1;
      }
    }
    else if (ldd == 1 && lds == 1) {
      for (uVar2 = 0; (uint)pts != uVar2; uVar2 = uVar2 + 1) {
        dest[uVar2] = (float)src[uVar2];
      }
    }
    else {
      while (bVar3 = pts != 0, pts = pts + -1, bVar3) {
        *dest = (float)*src;
        src = src + lds;
        dest = dest + ldd;
      }
    }
  }
  return;
}

Assistant:

extern void MPT_COPY_FCN(int pts, const MPT_COPY_ST *src, int lds, MPT_COPY_DT *dest, int ldd)
{
	int i, j;
	
	if (pts <= 0) {
		return;
	}
	if (!ldd) {
		dest[0] = src[(pts - 1) * lds];
		return;
	}
	if (!lds) {
		for (i = 0; i < pts; i++) {
			dest[i] = src[0];
		}
		return;
	}
	if (lds == 1 && ldd == 1) {
		for (i = 0; i < pts; i++) {
			dest[i] = src[i];
		}
		return;
	}
	for (i = 0, j = 0; pts--; i += ldd, j += lds) {
		dest[i] = src[j];
	}
}